

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O1

void __thiscall CChain::SetTip(CChain *this,CBlockIndex *block)

{
  long lVar1;
  pointer ppCVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::resize
            (&this->vChain,(long)block->nHeight + 1);
  do {
    ppCVar2 = (this->vChain).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppCVar2[block->nHeight] == block) break;
    ppCVar2[block->nHeight] = block;
    block = block->pprev;
  } while (block != (CBlockIndex *)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CChain::SetTip(CBlockIndex& block)
{
    CBlockIndex* pindex = &block;
    vChain.resize(pindex->nHeight + 1);
    while (pindex && vChain[pindex->nHeight] != pindex) {
        vChain[pindex->nHeight] = pindex;
        pindex = pindex->pprev;
    }
}